

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void sapp_lock_mouse(_Bool lock)

{
  undefined8 in_stack_ffffffffffffffc8;
  uint uVar1;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  ushort uStack_14;
  undefined1 uStack_12;
  undefined8 uStack_10;
  ushort *puStack_8;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  uVar1 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (_sapp.mouse.locked != lock) {
    _sapp.mouse.dx = 0.0;
    _sapp.mouse.dy = 0.0;
    _sapp.mouse.locked = lock;
    if (lock) {
      if (_sapp.x11.xi.available) {
        puStack_8 = &uStack_14;
        uStack_14 = 0;
        uStack_10 = 0x300000001;
        uStack_12 = 2;
        XISelectEvents(_sapp.x11.display,_sapp.x11.root,&uStack_10,1);
      }
      XGrabPointer(_sapp.x11.display,_sapp.x11.window,1,0x4c,1,1,_sapp.x11.window,
                   _sapp.x11.hidden_cursor,0);
    }
    else {
      if (_sapp.x11.xi.available) {
        puStack_8 = &uStack_14;
        uStack_14 = uStack_14 & 0xff00;
        uStack_10 = 0x100000001;
        XISelectEvents(_sapp.x11.display,_sapp.x11.root,&uStack_10,1);
      }
      XWarpPointer(_sapp.x11.display,0,_sapp.x11.window,0,0,0,(ulong)uVar1 << 0x20,
                   CONCAT44(uVar2,(int)_sapp.mouse.x),CONCAT44(uVar3,(int)_sapp.mouse.y));
      XUngrabPointer(_sapp.x11.display,0);
    }
    XFlush(_sapp.x11.display);
  }
  return;
}

Assistant:

SOKOL_API_IMPL void sapp_lock_mouse(bool lock) {
    #if defined(_SAPP_MACOS)
    _sapp_macos_lock_mouse(lock);
    #elif defined(_SAPP_EMSCRIPTEN)
    _sapp_emsc_lock_mouse(lock);
    #elif defined(_SAPP_WIN32)
    _sapp_win32_lock_mouse(lock);
    #elif defined(_SAPP_LINUX)
    _sapp_x11_lock_mouse(lock);
    #else
    _sapp.mouse.locked = lock;
    #endif
}